

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Value_Slider.cxx
# Opt level: O3

void __thiscall
Fl_Hor_Value_Slider::Fl_Hor_Value_Slider(Fl_Hor_Value_Slider *this,int X,int Y,int W,int H,char *l)

{
  Fl_Slider::Fl_Slider((Fl_Slider *)this,X,Y,W,H,l);
  (this->super_Fl_Value_Slider).super_Fl_Slider.super_Fl_Valuator.A = 1.0;
  (this->super_Fl_Value_Slider).super_Fl_Slider.super_Fl_Valuator.B = 100;
  *(undefined8 *)&(this->super_Fl_Value_Slider).super_Fl_Slider.field_0xac = 0xa00000000;
  (this->super_Fl_Value_Slider).textcolor_ = 0;
  (this->super_Fl_Value_Slider).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget._vptr_Fl_Widget =
       (_func_int **)&PTR__Fl_Widget_00279ee8;
  (this->super_Fl_Value_Slider).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.type_ = '\x01';
  return;
}

Assistant:

Fl_Hor_Value_Slider::Fl_Hor_Value_Slider(int X,int Y,int W,int H,const char *l)
: Fl_Value_Slider(X,Y,W,H,l) {
  type(FL_HOR_SLIDER);
}